

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_NtkFree(Sfm_Ntk_t *p)

{
  char *__ptr;
  word *pwVar1;
  void *pvVar2;
  int *piVar3;
  Vec_Wec_t *pVVar4;
  int iVar5;
  Vec_Str_t *pVVar6;
  Vec_Wrd_t *pVVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  
  pVVar6 = p->vFixed;
  __ptr = pVVar6->pArray;
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  free(pVVar6);
  pVVar6 = p->vEmpty;
  if (pVVar6 != (Vec_Str_t *)0x0) {
    if (pVVar6->pArray != (char *)0x0) {
      free(pVVar6->pArray);
      p->vEmpty->pArray = (char *)0x0;
      pVVar6 = p->vEmpty;
      if (pVVar6 == (Vec_Str_t *)0x0) goto LAB_00539617;
    }
    free(pVVar6);
    p->vEmpty = (Vec_Str_t *)0x0;
  }
LAB_00539617:
  pVVar7 = p->vTruths;
  pwVar1 = pVVar7->pArray;
  if (pwVar1 != (word *)0x0) {
    free(pwVar1);
  }
  free(pVVar7);
  iVar5 = (p->vFanins).nCap;
  pVVar8 = (p->vFanins).pArray;
  if (iVar5 < 1) {
    if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_0053967b;
  }
  else {
    lVar9 = 8;
    lVar10 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar8->nCap + lVar9);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar8 = (p->vFanins).pArray;
        *(undefined8 *)((long)&pVVar8->nCap + lVar9) = 0;
        iVar5 = (p->vFanins).nCap;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar10 < iVar5);
LAB_0053967b:
    free(pVVar8);
    (p->vFanins).pArray = (Vec_Int_t *)0x0;
  }
  (p->vFanins).nCap = 0;
  (p->vFanins).nSize = 0;
  pVVar8 = p->vStarts;
  piVar3 = pVVar8->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar8);
  pVVar7 = p->vTruths2;
  pwVar1 = pVVar7->pArray;
  if (pwVar1 != (word *)0x0) {
    free(pwVar1);
  }
  free(pVVar7);
  iVar5 = (p->vFanouts).nCap;
  pVVar8 = (p->vFanouts).pArray;
  if (iVar5 < 1) {
    if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_0053970e;
  }
  else {
    lVar9 = 8;
    lVar10 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar8->nCap + lVar9);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar8 = (p->vFanouts).pArray;
        *(undefined8 *)((long)&pVVar8->nCap + lVar9) = 0;
        iVar5 = (p->vFanouts).nCap;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar10 < iVar5);
LAB_0053970e:
    free(pVVar8);
    (p->vFanouts).pArray = (Vec_Int_t *)0x0;
  }
  (p->vFanouts).nCap = 0;
  (p->vFanouts).nSize = 0;
  piVar3 = (p->vLevels).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vLevels).pArray = (int *)0x0;
  }
  piVar3 = (p->vLevelsR).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vLevelsR).pArray = (int *)0x0;
  }
  piVar3 = (p->vCounts).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vCounts).pArray = (int *)0x0;
  }
  piVar3 = (p->vTravIds).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar3 = (p->vTravIds2).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vTravIds2).pArray = (int *)0x0;
  }
  piVar3 = (p->vId2Var).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vId2Var).pArray = (int *)0x0;
  }
  piVar3 = (p->vVar2Id).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vVar2Id).pArray = (int *)0x0;
  }
  pVVar4 = p->vCnfs;
  iVar5 = pVVar4->nCap;
  pVVar8 = pVVar4->pArray;
  if (iVar5 < 1) {
    if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_00539832;
  }
  else {
    lVar10 = 8;
    lVar9 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar8->nCap + lVar10);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar8 = pVVar4->pArray;
        *(undefined8 *)((long)&pVVar8->nCap + lVar10) = 0;
        iVar5 = pVVar4->nCap;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar9 < iVar5);
LAB_00539832:
    free(pVVar8);
  }
  free(pVVar4);
  pVVar8 = p->vCover;
  piVar3 = pVVar8->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar8);
  pVVar8 = p->vNodes;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vNodes->pArray = (int *)0x0;
      pVVar8 = p->vNodes;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_005398a4;
    }
    free(pVVar8);
    p->vNodes = (Vec_Int_t *)0x0;
  }
LAB_005398a4:
  pVVar8 = p->vDivs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vDivs->pArray = (int *)0x0;
      pVVar8 = p->vDivs;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_005398ec;
    }
    free(pVVar8);
    p->vDivs = (Vec_Int_t *)0x0;
  }
LAB_005398ec:
  pVVar8 = p->vRoots;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vRoots->pArray = (int *)0x0;
      pVVar8 = p->vRoots;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00539934;
    }
    free(pVVar8);
    p->vRoots = (Vec_Int_t *)0x0;
  }
LAB_00539934:
  pVVar8 = p->vTfo;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vTfo->pArray = (int *)0x0;
      pVVar8 = p->vTfo;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_0053997c;
    }
    free(pVVar8);
    p->vTfo = (Vec_Int_t *)0x0;
  }
LAB_0053997c:
  pVVar7 = p->vDivCexes;
  if (pVVar7 != (Vec_Wrd_t *)0x0) {
    if (pVVar7->pArray != (word *)0x0) {
      free(pVVar7->pArray);
      p->vDivCexes->pArray = (word *)0x0;
      pVVar7 = p->vDivCexes;
      if (pVVar7 == (Vec_Wrd_t *)0x0) goto LAB_005399c4;
    }
    free(pVVar7);
    p->vDivCexes = (Vec_Wrd_t *)0x0;
  }
LAB_005399c4:
  pVVar8 = p->vOrder;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vOrder->pArray = (int *)0x0;
      pVVar8 = p->vOrder;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00539a0c;
    }
    free(pVVar8);
    p->vOrder = (Vec_Int_t *)0x0;
  }
LAB_00539a0c:
  pVVar8 = p->vDivVars;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vDivVars->pArray = (int *)0x0;
      pVVar8 = p->vDivVars;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00539a54;
    }
    free(pVVar8);
    p->vDivVars = (Vec_Int_t *)0x0;
  }
LAB_00539a54:
  pVVar8 = p->vDivIds;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vDivIds->pArray = (int *)0x0;
      pVVar8 = p->vDivIds;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00539a9c;
    }
    free(pVVar8);
    p->vDivIds = (Vec_Int_t *)0x0;
  }
LAB_00539a9c:
  pVVar8 = p->vLits;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vLits->pArray = (int *)0x0;
      pVVar8 = p->vLits;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00539ae4;
    }
    free(pVVar8);
    p->vLits = (Vec_Int_t *)0x0;
  }
LAB_00539ae4:
  pVVar8 = p->vValues;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vValues->pArray = (int *)0x0;
      pVVar8 = p->vValues;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00539b2c;
    }
    free(pVVar8);
    p->vValues = (Vec_Int_t *)0x0;
  }
LAB_00539b2c:
  pVVar4 = p->vClauses;
  if (pVVar4 != (Vec_Wec_t *)0x0) {
    iVar5 = pVVar4->nCap;
    pVVar8 = pVVar4->pArray;
    if (iVar5 < 1) {
      if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_00539b82;
    }
    else {
      lVar10 = 8;
      lVar9 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar8->nCap + lVar10);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          pVVar8 = pVVar4->pArray;
          *(undefined8 *)((long)&pVVar8->nCap + lVar10) = 0;
          iVar5 = pVVar4->nCap;
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < iVar5);
LAB_00539b82:
      free(pVVar8);
    }
    free(pVVar4);
    p->vClauses = (Vec_Wec_t *)0x0;
  }
  pVVar8 = p->vFaninMap;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    if (pVVar8->pArray != (int *)0x0) {
      free(pVVar8->pArray);
      p->vFaninMap->pArray = (int *)0x0;
      pVVar8 = p->vFaninMap;
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_00539be2;
    }
    free(pVVar8);
    p->vFaninMap = (Vec_Int_t *)0x0;
  }
LAB_00539be2:
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  free(p);
  return;
}

Assistant:

void Sfm_NtkFree( Sfm_Ntk_t * p )
{
    // user data
    Vec_StrFree( p->vFixed );
    Vec_StrFreeP( &p->vEmpty );
    Vec_WrdFree( p->vTruths );
    Vec_WecErase( &p->vFanins );
    Vec_IntFree( p->vStarts );
    Vec_WrdFree( p->vTruths2 );
    // attributes
    Vec_WecErase( &p->vFanouts );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vLevelsR.pArray );
    ABC_FREE( p->vCounts.pArray );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vTravIds2.pArray );
    ABC_FREE( p->vId2Var.pArray );
    ABC_FREE( p->vVar2Id.pArray );
    Vec_WecFree( p->vCnfs );
    Vec_IntFree( p->vCover );
    // other data
    Vec_IntFreeP( &p->vNodes );
    Vec_IntFreeP( &p->vDivs  );
    Vec_IntFreeP( &p->vRoots );
    Vec_IntFreeP( &p->vTfo   );
    Vec_WrdFreeP( &p->vDivCexes );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vDivVars );
    Vec_IntFreeP( &p->vDivIds );
    Vec_IntFreeP( &p->vLits  );
    Vec_IntFreeP( &p->vValues );
    Vec_WecFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vFaninMap );
    if ( p->pSat  ) sat_solver_delete( p->pSat );
    ABC_FREE( p );
}